

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall
JsonArray_BeginArrayReturnsError_Test::~JsonArray_BeginArrayReturnsError_Test
          (JsonArray_BeginArrayReturnsError_Test *this)

{
  JsonArray_BeginArrayReturnsError_Test *this_local;
  
  ~JsonArray_BeginArrayReturnsError_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonArray, BeginArrayReturnsError) {
    std::error_code const error = make_error_code (std::errc::io_error);
    using ::testing::Return;
    EXPECT_CALL (callbacks_, begin_array ()).WillOnce (Return (error));

    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    EXPECT_EQ (p.last_error (), error);
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 1U}));
}